

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

void Memory::
     DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::JsrtExternalArrayBuffer::JsrtExternalArrayBufferDetachedState>
               (AllocatorType *allocator,JsrtExternalArrayBufferDetachedState *obj)

{
  (**(obj->super_ExternalArrayBufferDetachedState).super_ArrayBufferDetachedStateBase.
     super_DetachedStateBase._vptr_DetachedStateBase)(obj);
  HeapAllocator::Free(allocator,obj,0x30);
  return;
}

Assistant:

void DeleteObject(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, T * obj)
{
    obj->~T();

    auto freeFunc = AllocatorInfo<TAllocator, T>::InstAllocatorFunc::GetFreeFunc(); // Use InstAllocatorFunc
    (allocator->*freeFunc)(
        (void*)obj, _AllocatorDelete<T, deleteFlags>::Size());
}